

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_order.c
# Opt level: O0

void rhash_swap_copy_u64_to_str(void *to,void *from,size_t length)

{
  ulong uVar1;
  undefined1 *local_48;
  char *dst_1;
  size_t index;
  uint64_t *dst;
  uint64_t *end;
  uint64_t *src;
  size_t length_local;
  void *from_local;
  void *to_local;
  
  if ((((long)(int)to | (ulong)from | length) & 7) == 0) {
    index = (size_t)to;
    end = (uint64_t *)from;
    while (end < (uint64_t *)((long)from + length)) {
      uVar1 = *end;
      *(ulong *)index =
           uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
           (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
           (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
      index = index + 8;
      end = end + 1;
    }
  }
  else {
    local_48 = (undefined1 *)to;
    for (dst_1 = (char *)0x0; dst_1 < length; dst_1 = dst_1 + 1) {
      *local_48 = *(undefined1 *)((long)from + ((ulong)dst_1 ^ 7));
      local_48 = local_48 + 1;
    }
  }
  return;
}

Assistant:

void rhash_swap_copy_u64_to_str(void* to, const void* from, size_t length)
{
	/* if all pointers and length are 64-bits aligned */
	if ( 0 == (( (int)((char*)to - (char*)0) | ((char*)from - (char*)0) | length ) & 7) ) {
		/* copy aligned memory block as 64-bit integers */
		const uint64_t* src = (const uint64_t*)from;
		const uint64_t* end = (const uint64_t*)((const char*)src + length);
		uint64_t* dst = (uint64_t*)to;
		while (src < end) *(dst++) = bswap_64( *(src++) );
	} else {
		size_t index;
		char* dst = (char*)to;
		for (index = 0; index < length; index++) *(dst++) = ((char*)from)[index ^ 7];
	}
}